

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

i16 sqlite3TableColumnToStorage(Table *pTab,i16 iCol)

{
  uint uVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  long lVar3;
  
  uVar2 = CONCAT62(in_register_00000032,iCol);
  uVar1 = (uint)uVar2;
  if ((-1 < iCol) && ((pTab->tabFlags & 0x20) != 0)) {
    if (iCol < 1) {
      uVar1 = 0;
      iCol = 0;
    }
    else {
      lVar3 = 0;
      iCol = 0;
      do {
        iCol = iCol + (ushort)((*(byte *)((long)&pTab->aCol->colFlags + lVar3) & 0x20) == 0);
        lVar3 = lVar3 + 0x10;
      } while ((uVar2 & 0xffffffff) << 4 != lVar3);
    }
    if ((pTab->aCol[uVar1].colFlags & 0x20) != 0) {
      return ((short)uVar1 - iCol) + pTab->nNVCol;
    }
  }
  return iCol;
}

Assistant:

SQLITE_PRIVATE i16 sqlite3TableColumnToStorage(Table *pTab, i16 iCol){
  int i;
  i16 n;
  assert( iCol<pTab->nCol );
  if( (pTab->tabFlags & TF_HasVirtual)==0 || iCol<0 ) return iCol;
  for(i=0, n=0; i<iCol; i++){
    if( (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) n++;
  }
  if( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL ){
    /* iCol is a virtual column itself */
    return pTab->nNVCol + i - n;
  }else{
    /* iCol is a normal or stored column */
    return n;
  }
}